

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O0

Pass * wasm::createRemoveNonJSOpsPass(void)

{
  RemoveNonJSOpsPass *this;
  
  this = (RemoveNonJSOpsPass *)operator_new(0x1c0);
  memset(this,0,0x1c0);
  RemoveNonJSOpsPass::RemoveNonJSOpsPass(this);
  return (Pass *)this;
}

Assistant:

Pass* createRemoveNonJSOpsPass() { return new RemoveNonJSOpsPass(); }